

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbePmaReaderIncrInit(PmaReader *pReadr,int eMode)

{
  IncrMerger *pIVar1;
  void *pCtx;
  int rc;
  IncrMerger *pIncr;
  int eMode_local;
  PmaReader *pReadr_local;
  
  pIVar1 = pReadr->pIncr;
  pCtx._4_4_ = 0;
  if (pIVar1 != (IncrMerger *)0x0) {
    if (pIVar1->bUseThread == 0) {
      pCtx._4_4_ = vdbePmaReaderIncrMergeInit(pReadr,eMode);
    }
    else {
      pCtx._4_4_ = vdbeSorterCreateThread(pIVar1->pTask,vdbePmaReaderBgIncrInit,pReadr);
    }
  }
  return pCtx._4_4_;
}

Assistant:

static int vdbePmaReaderIncrInit(PmaReader *pReadr, int eMode){
  IncrMerger *pIncr = pReadr->pIncr;   /* Incremental merger */
  int rc = SQLITE_OK;                  /* Return code */
  if( pIncr ){
#if SQLITE_MAX_WORKER_THREADS>0
    assert( pIncr->bUseThread==0 || eMode==INCRINIT_TASK );
    if( pIncr->bUseThread ){
      void *pCtx = (void*)pReadr;
      rc = vdbeSorterCreateThread(pIncr->pTask, vdbePmaReaderBgIncrInit, pCtx);
    }else
#endif
    {
      rc = vdbePmaReaderIncrMergeInit(pReadr, eMode);
    }
  }
  return rc;
}